

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

pointer __thiscall
slang::SmallVectorBase<slang::ast::CoverageOptionSetter>::
emplaceRealloc<slang::ast::Scope_const&,slang::syntax::CoverageOptionSyntax_const&>
          (SmallVectorBase<slang::ast::CoverageOptionSetter> *this,pointer pos,Scope *args,
          CoverageOptionSyntax *args_1)

{
  size_type sVar1;
  size_type sVar2;
  size_type capacity;
  iterator pCVar3;
  CoverageOptionSetter *__result;
  CoverageOptionSetter *this_00;
  iterator __first;
  pointer newPos;
  pointer newData;
  size_type offset;
  size_type newCap;
  CoverageOptionSyntax *args_local_1;
  Scope *args_local;
  pointer pos_local;
  SmallVectorBase<slang::ast::CoverageOptionSetter> *this_local;
  
  sVar1 = this->len;
  sVar2 = max_size(this);
  if (sVar1 == sVar2) {
    slang::detail::throwLengthError();
  }
  capacity = calculateGrowth(this,this->len + 1);
  pCVar3 = begin(this);
  __result = (CoverageOptionSetter *)slang::detail::allocArray(capacity,0x18);
  this_00 = __result + ((long)pos - (long)pCVar3) / 0x18;
  ast::CoverageOptionSetter::CoverageOptionSetter(this_00,args,args_1);
  pCVar3 = end(this);
  if (pos == pCVar3) {
    __first = begin(this);
    pCVar3 = end(this);
    std::uninitialized_move<slang::ast::CoverageOptionSetter*,slang::ast::CoverageOptionSetter*>
              (__first,pCVar3,__result);
  }
  else {
    pCVar3 = begin(this);
    std::uninitialized_move<slang::ast::CoverageOptionSetter*,slang::ast::CoverageOptionSetter*>
              (pCVar3,pos,__result);
    pCVar3 = end(this);
    std::uninitialized_move<slang::ast::CoverageOptionSetter*,slang::ast::CoverageOptionSetter*>
              (pos,pCVar3,this_00 + 1);
  }
  cleanup(this,(EVP_PKEY_CTX *)pCVar3);
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = __result;
  return this_00;
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}